

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_and_ping(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char *local_2e8;
  undefined1 local_2d8 [4];
  int r;
  uv_stdio_container_t stdio [2];
  uv_buf_t buf;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  
  init_process_options("spawn_helper3",exit_cb);
  uVar3 = uv_buf_init("TEST",4);
  eval_a = (int64_t)uVar3.base;
  stdio[1].data = (anon_union_8_2_13e1ed65_for_data)eval_a;
  local_2e8 = (char *)uVar3.len;
  buf.base = local_2e8;
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,(uv_pipe_t *)&buf.len,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,(uv_pipe_t *)&out.pipe_fname,0);
  options.stdio = (uv_stdio_container_t *)local_2d8;
  local_2d8 = (undefined1  [4])0x11;
  stdio[0]._0_8_ = &out.pipe_fname;
  stdio[0].data.file = 0x21;
  stdio[1]._0_8_ = &buf.len;
  options.stdio_count = 2;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3a2,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_process_kill(&process,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3a8,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_write((uv_write_t *)&in.pipe_fname,(uv_stream_t *)&out.pipe_fname,
                   (uv_buf_t *)&stdio[1].data,1,write_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3ab,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)&buf.len,on_alloc,on_read);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3ae,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3b0,"exit_cb_called","==","0",(long)exit_cb_called,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3b3,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3b5,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  iVar1 = strcmp(output,"TEST");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3b6,"strcmp(output, \"TEST\")","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x3b8,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_and_ping) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_OK(strcmp(output, "TEST"));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}